

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsReport.cpp
# Opt level: O2

bool __thiscall KDReports::Report::isTableBreakingEnabled(Report *this)

{
  bool bVar1;
  int iVar2;
  
  iVar2 = (*((this->d)._M_t.
             super___uniq_ptr_impl<KDReports::ReportPrivate,_std::default_delete<KDReports::ReportPrivate>_>
             ._M_t.
             super__Tuple_impl<0UL,_KDReports::ReportPrivate_*,_std::default_delete<KDReports::ReportPrivate>_>
             .super__Head_base<0UL,_KDReports::ReportPrivate_*,_false>._M_head_impl)->m_layout->
            _vptr_AbstractReportLayout[0xb])();
  bVar1 = true;
  if (iVar2 == 1) {
    iVar2 = (*((this->d)._M_t.
               super___uniq_ptr_impl<KDReports::ReportPrivate,_std::default_delete<KDReports::ReportPrivate>_>
               ._M_t.
               super__Tuple_impl<0UL,_KDReports::ReportPrivate_*,_std::default_delete<KDReports::ReportPrivate>_>
               .super__Head_base<0UL,_KDReports::ReportPrivate_*,_false>._M_head_impl)->m_layout->
              _vptr_AbstractReportLayout[0xc])();
    bVar1 = 0 < iVar2;
  }
  return bVar1;
}

Assistant:

bool KDReports::Report::isTableBreakingEnabled() const
{
    return maximumNumberOfPagesForHorizontalScaling() != 1 || maximumNumberOfPagesForVerticalScaling() > 0;
}